

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O0

DdNode * Cudd_addOr(DdManager *dd,DdNode **f,DdNode **g)

{
  DdManager *pDVar1;
  DdManager *pDVar2;
  DdNode *G;
  DdNode *F;
  DdNode **g_local;
  DdNode **f_local;
  DdManager *dd_local;
  
  pDVar1 = (DdManager *)*f;
  pDVar2 = (DdManager *)*g;
  if ((pDVar1 == (DdManager *)dd->one) || (pDVar2 == (DdManager *)dd->one)) {
    dd_local = (DdManager *)dd->one;
  }
  else {
    dd_local = pDVar2;
    if ((((pDVar1->sentinel).index != 0x7fffffff) &&
        (dd_local = pDVar1, (pDVar2->sentinel).index != 0x7fffffff)) && (pDVar1 != pDVar2)) {
      if (pDVar2 < pDVar1) {
        *f = (DdNode *)pDVar2;
        *g = (DdNode *)pDVar1;
      }
      dd_local = (DdManager *)0x0;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addOr(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *F, *G;

    F = *f; G = *g;
    if (F == DD_ONE(dd) || G == DD_ONE(dd)) return(DD_ONE(dd));
    if (cuddIsConstant(F)) return(G);
    if (cuddIsConstant(G)) return(F);
    if (F == G) return(F);
    if (F > G) { /* swap f and g */
        *f = G;
        *g = F;
    }
    return(NULL);

}